

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

xml_node NULLCPugiXML::xml_node__find_child_by_attribute1
                   (NULLCArray attr_name,NULLCArray attr_value,xml_node *ptr)

{
  xml_node xVar1;
  char_t *attr_value_00;
  char *error;
  xml_node ret;
  xml_node local_28;
  
  attr_value_00 = attr_value.ptr;
  if (attr_name.ptr == (char_t *)0x0) {
    error = "attr_name is empty";
  }
  else {
    if (attr_value_00 != (char_t *)0x0) {
      pugi::xml_node::xml_node(&local_28);
      xVar1 = pugi::xml_node::find_child_by_attribute(&ptr->node,attr_name.ptr,attr_value_00);
      return (xml_node)(xml_node)xVar1._root;
    }
    error = "attr_value is empty";
  }
  nullcThrowError(error,CONCAT44((int)((ulong)register0x00000030 >> 0x20),attr_name.len),
                  attr_value_00,attr_value.len);
  local_28._root = (xml_node_struct *)0x0;
  pugi::xml_node::xml_node(&local_28);
  return (xml_node)(xml_node)local_28._root;
}

Assistant:

xml_node xml_node__find_child_by_attribute1(NULLCArray attr_name, NULLCArray attr_value, xml_node* ptr)
	{
		if(!attr_name.ptr)
		{
			nullcThrowError("attr_name is empty");
			return xml_node();
		}
		if(!attr_value.ptr)
		{
			nullcThrowError("attr_value is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.find_child_by_attribute(attr_name.ptr, attr_value.ptr);
		return ret;
	}